

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3MIBufferFree(void *p)

{
  char *p_00;
  MatchinfoBuffer *pBuf;
  void *p_local;
  
  p_00 = (char *)((long)p - (ulong)*(uint *)((long)p + -4));
  if ((char *)p == p_00 + 0x1c) {
    p_00[1] = '\0';
  }
  else {
    p_00[2] = '\0';
  }
  if (((*p_00 == '\0') && (p_00[1] == '\0')) && (p_00[2] == '\0')) {
    sqlite3_free(p_00);
  }
  return;
}

Assistant:

static void fts3MIBufferFree(void *p){
  MatchinfoBuffer *pBuf = (MatchinfoBuffer*)((u8*)p - ((u32*)p)[-1]);

  assert( (u32*)p==&pBuf->aMatchinfo[1] 
       || (u32*)p==&pBuf->aMatchinfo[pBuf->nElem+2] 
  );
  if( (u32*)p==&pBuf->aMatchinfo[1] ){
    pBuf->aRef[1] = 0;
  }else{
    pBuf->aRef[2] = 0;
  }

  if( pBuf->aRef[0]==0 && pBuf->aRef[1]==0 && pBuf->aRef[2]==0 ){
    sqlite3_free(pBuf);
  }
}